

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86::forward
          (DeconvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  _func_int *p_Var7;
  int *piVar8;
  void *pvVar9;
  size_t sVar10;
  void *pvVar11;
  Layer *pLVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Mat *pMVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  _func_int *p_Var37;
  int iVar38;
  int iVar39;
  long lVar40;
  void **ppvVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  float _h;
  int iVar48;
  size_t sVar49;
  long lVar50;
  uint uVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  v4sf one;
  float fVar55;
  float fVar56;
  float fVar63;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  void *local_2a0;
  Mat local_258;
  Mat *local_208;
  ulong local_200;
  ulong local_1f8;
  long local_1f0;
  Mat local_1e8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  Mat local_188;
  void *local_140;
  Mat *local_138;
  _func_int **local_130;
  Mat *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  int local_110;
  Allocator *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  int local_f0;
  ulong local_e8;
  void *local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  int local_c0;
  Allocator *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_a0;
  ulong local_98;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  
  iVar36 = bottom_blob->w;
  iVar44 = bottom_blob->h;
  uVar6 = bottom_blob->elemsize;
  local_198 = (ulong)bottom_blob->elempack;
  p_Var37 = this->_vptr_DeconvolutionDepthWise_x86[-3];
  uVar43 = 1;
  if (opt->use_packing_layout == true) {
    uVar43 = (uint)(((&this->field_0xd0)[(long)p_Var37] & 3) == 0) * 3 + 1;
  }
  iVar45 = *(int *)(&this->field_0xd4 + (long)p_Var37);
  iVar5 = *(int *)(&this->field_0xe4 + (long)p_Var37);
  iVar38 = (*(int *)(&this->field_0xd8 + (long)p_Var37) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var37);
  iVar39 = *(int *)(&this->field_0xe8 + (long)p_Var37);
  iVar42 = *(int *)(&this->field_0xdc + (long)p_Var37);
  iVar46 = *(int *)(&this->field_0xfc + (long)p_Var37);
  iVar48 = *(int *)(&this->field_0x100 + (long)p_Var37);
  local_190 = (ulong)(uint)bottom_blob->c;
  local_258.cstep = 0;
  local_258.data = (Mat *)0x0;
  local_258.refcount._0_4_ = 0;
  local_258.refcount._4_4_ = 0;
  local_258.elemsize._0_4_ = 0;
  local_258.elemsize._4_4_ = 0;
  local_258.elempack = 0;
  local_258.allocator = (Allocator *)0x0;
  local_258.dims = 0;
  local_258.w = 0;
  local_258.h = 0;
  local_258.d = 0;
  local_258.c = 0;
  p_Var7 = this->_vptr_DeconvolutionDepthWise_x86[-3];
  p_Var37 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86 + (long)p_Var7);
  lVar40 = 0x10;
  if (((((*(int *)(&this->field_0xec + (long)p_Var7) < 1) && (*(int *)(p_Var37 + 0xf0) < 1)) &&
       (*(int *)(p_Var37 + 0xf4) < 1)) && (*(int *)(p_Var37 + 0xf8) < 1)) &&
     ((*(int *)(p_Var37 + 0x104) < 1 || (*(int *)(p_Var37 + 0x108) < 1)))) {
    if (&local_258 != top_blob) {
      piVar8 = top_blob->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      local_258.data = top_blob->data;
      local_258.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_258.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_258.elemsize._0_4_ = (undefined4)top_blob->elemsize;
      local_258.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
      local_258.elempack = top_blob->elempack;
      local_258.allocator = top_blob->allocator;
      uVar15 = top_blob->dims;
      uVar16 = top_blob->w;
      uVar17 = top_blob->h;
      uVar18 = top_blob->d;
      local_258.c = top_blob->c;
      local_258.cstep = top_blob->cstep;
      local_258.dims = uVar15;
      local_258.w = uVar16;
      local_258.h = uVar17;
      local_258.d = uVar18;
    }
    p_Var37 = (_func_int *)
              ((long)&this->_vptr_DeconvolutionDepthWise_x86 +
              (long)this->_vptr_DeconvolutionDepthWise_x86[-3]);
    lVar40 = 8;
  }
  iVar42 = (iVar45 + -1) * iVar42;
  iVar45 = iVar46 + (iVar36 + -1) * iVar5 + iVar42 + 1;
  _h = (float)(iVar48 + (iVar44 + -1) * iVar39 + iVar38 + 1);
  sVar49 = (uVar6 / local_198) * (ulong)uVar43;
  local_208 = bottom_blob;
  local_138 = top_blob;
  Mat::create(&local_258,iVar45,(int)_h,*(int *)(p_Var37 + 0xd0) / (int)uVar43,sVar49,uVar43,
              *(Allocator **)(&opt->lightmode + lVar40));
  pMVar30 = local_208;
  auVar29 = _DAT_00598250;
  auVar28 = _DAT_00598230;
  auVar27 = _DAT_00598220;
  if (((Mat *)local_258.data == (Mat *)0x0) || ((long)local_258.c * local_258.cstep == 0)) {
    iVar36 = -100;
  }
  else {
    p_Var37 = this->_vptr_DeconvolutionDepthWise_x86[-3];
    iVar5 = *(int *)(&this->field_0x114 + (long)p_Var37);
    iVar46 = (int)local_198;
    iVar39 = (int)local_190;
    if ((iVar46 * iVar39 == iVar5) && (iVar5 == *(int *)(&this->field_0xd0 + (long)p_Var37))) {
      uVar43 = *(int *)(&this->field_0xd8 + (long)p_Var37) *
               *(int *)(&this->field_0xd4 + (long)p_Var37);
      if (iVar46 == 1) {
        if (0 < iVar39) {
          local_208 = (Mat *)local_258.data;
          local_1f8 = local_258.cstep *
                      CONCAT44(local_258.elemsize._4_4_,(undefined4)local_258.elemsize);
          local_2a0 = (this->weight_data_tm).data;
          local_140 = pMVar30->data;
          local_1a0 = pMVar30->cstep * pMVar30->elemsize;
          local_1f0 = (long)pMVar30->w * pMVar30->elemsize;
          local_198 = 1;
          if (1 < iVar39) {
            local_198 = local_190 & 0xffffffff;
          }
          local_190 = (long)(int)uVar43 << 2;
          local_200 = 0;
          do {
            pvVar9 = local_140;
            if (0 < (int)_h) {
              lVar40 = local_1a0 * local_200;
              ppvVar41 = (void **)((long)&local_208->data + local_1f8 * local_200);
              local_130 = this->_vptr_DeconvolutionDepthWise_x86;
              fVar52 = 0.0;
              do {
                if (0 < iVar45) {
                  iVar39 = 0;
                  iVar5 = -iVar42;
                  do {
                    p_Var37 = local_130[-3];
                    if (*(int *)(&this->field_0x10c + (long)p_Var37) == 0) {
                      fVar53 = 0.0;
                    }
                    else {
                      fVar53 = *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var37) +
                                         local_200 * 4);
                    }
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var37)) {
                      iVar46 = 0;
                      do {
                        iVar48 = *(int *)(&this->field_0xe0 + (long)p_Var37) * iVar46 +
                                 ((int)fVar52 - iVar38);
                        if (((-1 < iVar48) &&
                            (iVar31 = iVar48 / *(int *)(&this->field_0xe8 + (long)p_Var37),
                            iVar48 % *(int *)(&this->field_0xe8 + (long)p_Var37) == 0)) &&
                           (iVar31 < iVar44)) {
                          iVar48 = *(int *)(&this->field_0xd4 + (long)p_Var37);
                          if (0 < (long)iVar48) {
                            lVar50 = 0;
                            iVar32 = iVar5;
                            do {
                              if (((-1 < iVar32) &&
                                  (iVar33 = iVar32 / *(int *)(&this->field_0xe4 + (long)p_Var37),
                                  iVar32 % *(int *)(&this->field_0xe4 + (long)p_Var37) == 0)) &&
                                 (iVar33 < iVar36)) {
                                fVar53 = fVar53 + *(float *)((long)local_2a0 +
                                                            lVar50 * 4 +
                                                            (ulong)(uint)(iVar48 * iVar46) * 4) *
                                                  *(float *)((long)pvVar9 +
                                                            (long)iVar33 * 4 +
                                                            iVar31 * local_1f0 + lVar40);
                              }
                              lVar50 = lVar50 + 1;
                              iVar32 = iVar32 + *(int *)(&this->field_0xdc + (long)p_Var37);
                            } while (iVar48 != lVar50);
                          }
                        }
                        iVar46 = iVar46 + 1;
                      } while (iVar46 != *(int *)(&this->field_0xd8 + (long)p_Var37));
                    }
                    fVar54 = fVar53;
                    switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var37)) {
                    case 1:
                      if (fVar53 <= 0.0) {
                        fVar54 = 0.0;
                      }
                      break;
                    case 2:
                      fVar54 = (float)(-(uint)(0.0 < fVar53) & 0x3f800000 |
                                      ~-(uint)(0.0 < fVar53) &
                                      **(uint **)(&this->field_0x120 + (long)p_Var37)) * fVar53;
                      break;
                    case 3:
                      fVar54 = **(float **)(&this->field_0x120 + (long)p_Var37);
                      if (fVar53 <= fVar54) {
                        fVar53 = fVar54;
                      }
                      fVar55 = (*(float **)(&this->field_0x120 + (long)p_Var37))[1];
                      fVar54 = fVar53;
                      if (fVar55 < fVar53) {
LAB_00450fa3:
                        fVar54 = fVar55;
                      }
                      break;
                    case 4:
                      if (88.37626 <= fVar53) {
                        fVar53 = 88.37626;
                      }
                      fVar53 = expf((float)(-(uint)(fVar53 < -88.37626) & 0x42b0c0a5 |
                                           ~-(uint)(fVar53 < -88.37626) & (uint)-fVar53));
                      fVar54 = 1.0 / (fVar53 + 1.0);
                      break;
                    case 5:
                      uStack_84 = 0;
                      uStack_80 = 0;
                      uStack_7c = 0;
                      local_88 = fVar53;
                      fVar53 = expf(fVar53);
                      fVar53 = logf(fVar53 + 1.0);
                      fVar53 = tanhf(fVar53);
                      fVar54 = fVar53 * local_88;
                      break;
                    case 6:
                      fVar55 = **(float **)(&this->field_0x120 + (long)p_Var37);
                      fVar56 = (*(float **)(&this->field_0x120 + (long)p_Var37))[1];
                      fVar66 = -fVar56 / fVar55;
                      fVar54 = 0.0;
                      if ((fVar66 <= fVar53) && (fVar54 = fVar53, fVar53 <= fVar66 + 1.0 / fVar55))
                      {
                        fVar55 = (fVar55 * fVar53 + fVar56) * fVar53;
                        goto LAB_00450fa3;
                      }
                    }
                    *(float *)ppvVar41 = fVar54;
                    ppvVar41 = (void **)((long)ppvVar41 + 4);
                    iVar39 = iVar39 + 1;
                    iVar5 = iVar5 + 1;
                  } while (iVar39 != iVar45);
                }
                fVar52 = (float)((int)fVar52 + 1);
              } while (fVar52 != _h);
            }
            local_200 = local_200 + 1;
            local_2a0 = (void *)((long)local_2a0 + local_190);
          } while (local_200 != local_198);
        }
      }
      else if ((iVar46 == 4) && (local_1a0 = (ulong)uVar43, 0 < iVar39)) {
        local_140 = (void *)CONCAT44(local_140._4_4_,uVar43 * 4);
        local_1f8 = 0;
        fVar52 = (float)DAT_00598250;
        fVar53 = DAT_00598250._4_4_;
        fVar54 = DAT_00598250._8_4_;
        fVar55 = DAT_00598250._12_4_;
        do {
          if (0 < (int)_h) {
            pvVar9 = (this->weight_data_tm).data;
            sVar49 = local_208->cstep;
            sVar10 = local_208->elemsize;
            pvVar11 = local_208->data;
            ppvVar41 = (void **)((long)(void **)local_258.data +
                                local_258.cstep * local_1f8 *
                                CONCAT44(local_258.elemsize._4_4_,(undefined4)local_258.elemsize));
            local_130 = this->_vptr_DeconvolutionDepthWise_x86;
            local_1f0 = (long)local_208->w * sVar10;
            local_200 = local_1f8 * 0x10;
            fVar56 = 0.0;
            do {
              local_88 = fVar56;
              if (0 < iVar45) {
                iVar39 = 0;
                iVar5 = -iVar42;
                do {
                  auVar62 = ZEXT816(0);
                  p_Var37 = local_130[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var37) == 0) {
                    auVar76 = ZEXT816(0);
                  }
                  else {
                    auVar76 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1b0 + (long)p_Var37) + local_200);
                  }
                  if (0 < *(int *)(&this->field_0xd8 + (long)p_Var37)) {
                    iVar46 = 0;
                    iVar48 = 0;
                    do {
                      iVar31 = *(int *)(&this->field_0xe0 + (long)p_Var37) * iVar48 +
                               ((int)local_88 - iVar38);
                      if (((-1 < iVar31) &&
                          (iVar32 = iVar31 / *(int *)(&this->field_0xe8 + (long)p_Var37),
                          iVar31 % *(int *)(&this->field_0xe8 + (long)p_Var37) == 0)) &&
                         (iVar32 < iVar44)) {
                        lVar40 = (long)*(int *)(&this->field_0xd4 + (long)p_Var37);
                        if (0 < lVar40) {
                          uVar51 = *(int *)(&this->field_0xd4 + (long)p_Var37) * iVar46;
                          auVar61 = auVar76;
                          iVar31 = iVar5;
                          do {
                            auVar76 = auVar61;
                            if (((-1 < iVar31) &&
                                (iVar33 = iVar31 / *(int *)(&this->field_0xe4 + (long)p_Var37),
                                iVar31 % *(int *)(&this->field_0xe4 + (long)p_Var37) == 0)) &&
                               (iVar33 < iVar36)) {
                              auVar4 = *(undefined1 (*) [16])
                                        ((long)pvVar11 +
                                        (long)(iVar33 << 2) * 4 +
                                        iVar32 * local_1f0 + sVar49 * local_1f8 * sVar10);
                              pfVar1 = (float *)((long)pvVar9 +
                                                (ulong)uVar51 * 4 +
                                                (long)(int)(uVar43 * 4 * (int)local_1f8) * 4);
                              auVar76._0_4_ = auVar61._0_4_ + *pfVar1 * auVar4._0_4_;
                              auVar76._4_4_ = auVar61._4_4_ + pfVar1[1] * auVar4._4_4_;
                              auVar76._8_4_ = auVar61._8_4_ + pfVar1[2] * auVar4._8_4_;
                              auVar76._12_4_ = auVar61._12_4_ + pfVar1[3] * auVar4._12_4_;
                            }
                            uVar51 = uVar51 + 4;
                            iVar31 = iVar31 + *(int *)(&this->field_0xdc + (long)p_Var37);
                            lVar40 = lVar40 + -1;
                            auVar61 = auVar76;
                          } while (lVar40 != 0);
                        }
                      }
                      iVar48 = iVar48 + 1;
                      iVar46 = iVar46 + 4;
                    } while (iVar48 != *(int *)(&this->field_0xd8 + (long)p_Var37));
                  }
                  fVar56 = auVar76._0_4_;
                  fVar66 = auVar76._4_4_;
                  fVar63 = auVar76._8_4_;
                  fVar68 = auVar76._12_4_;
                  switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var37)) {
                  case 1:
                    auVar76 = maxps(auVar76,auVar62);
                    break;
                  case 2:
                    auVar61 = maxps(auVar76,auVar62);
                    auVar62 = minps(auVar76,auVar62);
                    fVar56 = **(float **)(&this->field_0x120 + (long)p_Var37);
                    auVar76._4_4_ = fVar56 * auVar62._4_4_ + auVar61._4_4_;
                    auVar76._0_4_ = fVar56 * auVar62._0_4_ + auVar61._0_4_;
                    auVar76._8_4_ = fVar56 * auVar62._8_4_ + auVar61._8_4_;
                    auVar76._12_4_ = fVar56 * auVar62._12_4_ + auVar61._12_4_;
                    break;
                  case 3:
                    uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var37);
                    uVar3 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var37))[1];
                    auVar59._4_4_ = uVar2;
                    auVar59._0_4_ = uVar2;
                    auVar59._8_4_ = uVar2;
                    auVar59._12_4_ = uVar2;
                    auVar62 = maxps(auVar76,auVar59);
                    auVar14._4_4_ = uVar3;
                    auVar14._0_4_ = uVar3;
                    auVar14._8_4_ = uVar3;
                    auVar14._12_4_ = uVar3;
                    auVar76 = minps(auVar62,auVar14);
                    break;
                  case 4:
                    auVar64._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                    auVar64._8_4_ = -fVar63;
                    auVar64._12_4_ = -fVar68;
                    auVar62 = minps(auVar64,auVar27);
                    auVar62 = maxps(auVar62,auVar28);
                    fVar66 = auVar62._0_4_ * 1.442695 + 0.5;
                    fVar68 = auVar62._4_4_ * 1.442695 + 0.5;
                    fVar72 = auVar62._8_4_ * 1.442695 + 0.5;
                    fVar74 = auVar62._12_4_ * 1.442695 + 0.5;
                    fVar56 = (float)(int)fVar66;
                    fVar63 = (float)(int)fVar68;
                    fVar71 = (float)(int)fVar72;
                    fVar73 = (float)(int)fVar74;
                    fVar56 = fVar56 - (float)(-(uint)(fVar66 < fVar56) & (uint)fVar52);
                    fVar63 = fVar63 - (float)(-(uint)(fVar68 < fVar63) & (uint)fVar53);
                    fVar71 = fVar71 - (float)(-(uint)(fVar72 < fVar71) & (uint)fVar54);
                    fVar73 = fVar73 - (float)(-(uint)(fVar74 < fVar73) & (uint)fVar55);
                    fVar66 = fVar56 * -0.6931472 + auVar62._0_4_;
                    fVar68 = fVar63 * -0.6931472 + auVar62._4_4_;
                    fVar72 = fVar71 * -0.6931472 + auVar62._8_4_;
                    fVar74 = fVar73 * -0.6931472 + auVar62._12_4_;
                    auVar60._0_4_ =
                         fVar66 + fVar52 +
                         (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) *
                            fVar66 + 0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) *
                         fVar66 * fVar66;
                    auVar60._4_4_ =
                         fVar68 + fVar53 +
                         (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) *
                            fVar68 + 0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5) *
                         fVar68 * fVar68;
                    auVar60._8_4_ =
                         fVar72 + fVar54 +
                         (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) *
                            fVar72 + 0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) *
                         fVar72 * fVar72;
                    auVar60._12_4_ =
                         fVar74 + fVar55 +
                         (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) *
                            fVar74 + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) *
                         fVar74 * fVar74;
                    fVar72 = (float)((int)fVar56 * 0x800000 + (int)fVar52) * auVar60._0_4_ + fVar52;
                    fVar74 = (float)((int)fVar63 * 0x800000 + (int)fVar53) * auVar60._4_4_ + fVar53;
                    fVar71 = (float)((int)fVar71 * 0x800000 + (int)fVar54) * auVar60._8_4_ + fVar54;
                    fVar73 = (float)((int)fVar73 * 0x800000 + (int)fVar55) * auVar60._12_4_ + fVar55
                    ;
                    auVar13._4_4_ = fVar74;
                    auVar13._0_4_ = fVar72;
                    auVar13._8_4_ = fVar71;
                    auVar13._12_4_ = fVar73;
                    auVar62 = rcpps(auVar60,auVar13);
                    fVar56 = auVar62._0_4_;
                    fVar66 = auVar62._4_4_;
                    fVar63 = auVar62._8_4_;
                    fVar68 = auVar62._12_4_;
                    auVar76._0_4_ = (fVar52 - fVar72 * fVar56) * fVar56 + fVar56;
                    auVar76._4_4_ = (fVar53 - fVar74 * fVar66) * fVar66 + fVar66;
                    auVar76._8_4_ = (fVar54 - fVar71 * fVar63) * fVar63 + fVar63;
                    auVar76._12_4_ = (fVar55 - fVar73 * fVar68) * fVar68 + fVar68;
                    break;
                  case 5:
                    auVar62 = minps(auVar76,auVar27);
                    auVar62 = maxps(auVar62,auVar28);
                    fVar71 = auVar62._0_4_ * 1.442695 + 0.5;
                    fVar72 = auVar62._4_4_ * 1.442695 + 0.5;
                    fVar73 = auVar62._8_4_ * 1.442695 + 0.5;
                    fVar74 = auVar62._12_4_ * 1.442695 + 0.5;
                    fVar65 = (float)(int)fVar71;
                    fVar67 = (float)(int)fVar72;
                    fVar69 = (float)(int)fVar73;
                    fVar70 = (float)(int)fVar74;
                    fVar65 = fVar65 - (float)(-(uint)(fVar71 < fVar65) & (uint)fVar52);
                    fVar67 = fVar67 - (float)(-(uint)(fVar72 < fVar67) & (uint)fVar53);
                    fVar69 = fVar69 - (float)(-(uint)(fVar73 < fVar69) & (uint)fVar54);
                    fVar70 = fVar70 - (float)(-(uint)(fVar74 < fVar70) & (uint)fVar55);
                    fVar71 = auVar62._0_4_ - fVar65 * 0.6931472;
                    fVar72 = auVar62._4_4_ - fVar67 * 0.6931472;
                    fVar73 = auVar62._8_4_ - fVar69 * 0.6931472;
                    fVar74 = auVar62._12_4_ - fVar70 * 0.6931472;
                    auVar75._0_4_ =
                         (float)((int)fVar65 * 0x800000 + (int)fVar52) *
                         (fVar71 + fVar52 +
                         (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) *
                            fVar71 + 0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) *
                         fVar71 * fVar71) + fVar52;
                    auVar75._4_4_ =
                         (float)((int)fVar67 * 0x800000 + (int)fVar53) *
                         (fVar72 + fVar53 +
                         (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) *
                            fVar72 + 0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) *
                         fVar72 * fVar72) + fVar53;
                    auVar75._8_4_ =
                         (float)((int)fVar69 * 0x800000 + (int)fVar54) *
                         (fVar73 + fVar54 +
                         (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) *
                            fVar73 + 0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) *
                         fVar73 * fVar73) + fVar54;
                    auVar75._12_4_ =
                         (float)((int)fVar70 * 0x800000 + (int)fVar55) *
                         (fVar74 + fVar55 +
                         (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) *
                            fVar74 + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) *
                         fVar74 * fVar74) + fVar55;
                    auVar76 = maxps(auVar75,_DAT_005982c0);
                    fVar71 = (float)(auVar76._0_4_ & 0x807fffff | 0x3f000000);
                    fVar73 = (float)(auVar76._4_4_ & 0x807fffff | 0x3f000000);
                    fVar65 = (float)(auVar76._8_4_ & 0x807fffff | 0x3f000000);
                    fVar69 = (float)(auVar76._12_4_ & 0x807fffff | 0x3f000000);
                    fVar72 = fVar71 + -1.0 + (float)(-(uint)(fVar71 < 0.70710677) & (uint)fVar71);
                    fVar74 = fVar73 + -1.0 + (float)(-(uint)(fVar73 < 0.70710677) & (uint)fVar73);
                    fVar67 = fVar65 + -1.0 + (float)(-(uint)(fVar65 < 0.70710677) & (uint)fVar65);
                    fVar70 = fVar69 + -1.0 + (float)(-(uint)(fVar69 < 0.70710677) & (uint)fVar69);
                    auVar57._0_8_ =
                         CONCAT44(-(uint)(auVar75._4_4_ <= 0.0),-(uint)(auVar75._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar57._8_4_ = -(uint)(auVar75._8_4_ <= 0.0) & 0x7fffffff;
                    auVar57._12_4_ = -(uint)(auVar75._12_4_ <= 0.0) & 0x7fffffff;
                    auVar62._4_4_ =
                         ~-(uint)(auVar75._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar73 < 0.70710677) & (uint)fVar53)) * 0.6931472 +
                                 fVar74 + (((((((((fVar74 * 0.070376836 + -0.1151461) * fVar74 +
                                                 0.116769984) * fVar74 + -0.12420141) * fVar74 +
                                               0.14249323) * fVar74 + -0.16668057) * fVar74 +
                                             0.20000714) * fVar74 + -0.24999994) * fVar74 +
                                           0.3333333) * fVar74 + -0.5) * fVar74 * fVar74) * -2.0);
                    auVar62._0_4_ =
                         ~-(uint)(auVar75._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar71 < 0.70710677) & (uint)fVar52)) * 0.6931472 +
                                 fVar72 + (((((((((fVar72 * 0.070376836 + -0.1151461) * fVar72 +
                                                 0.116769984) * fVar72 + -0.12420141) * fVar72 +
                                               0.14249323) * fVar72 + -0.16668057) * fVar72 +
                                             0.20000714) * fVar72 + -0.24999994) * fVar72 +
                                           0.3333333) * fVar72 + -0.5) * fVar72 * fVar72) * -2.0);
                    auVar62._8_4_ =
                         ~-(uint)(auVar75._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar65 < 0.70710677) & (uint)fVar54)) * 0.6931472 +
                                 fVar67 + (((((((((fVar67 * 0.070376836 + -0.1151461) * fVar67 +
                                                 0.116769984) * fVar67 + -0.12420141) * fVar67 +
                                               0.14249323) * fVar67 + -0.16668057) * fVar67 +
                                             0.20000714) * fVar67 + -0.24999994) * fVar67 +
                                           0.3333333) * fVar67 + -0.5) * fVar67 * fVar67) * -2.0);
                    auVar62._12_4_ =
                         ~-(uint)(auVar75._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar69 < 0.70710677) & (uint)fVar55)) * 0.6931472 +
                                 fVar70 + (((((((((fVar70 * 0.070376836 + -0.1151461) * fVar70 +
                                                 0.116769984) * fVar70 + -0.12420141) * fVar70 +
                                               0.14249323) * fVar70 + -0.16668057) * fVar70 +
                                             0.20000714) * fVar70 + -0.24999994) * fVar70 +
                                           0.3333333) * fVar70 + -0.5) * fVar70 * fVar70) * -2.0);
                    auVar62 = minps(auVar57 | auVar62,auVar27);
                    auVar62 = maxps(auVar62,auVar28);
                    fVar71 = auVar62._0_4_ * 1.442695 + 0.5;
                    fVar72 = auVar62._4_4_ * 1.442695 + 0.5;
                    fVar73 = auVar62._8_4_ * 1.442695 + 0.5;
                    fVar74 = auVar62._12_4_ * 1.442695 + 0.5;
                    fVar65 = (float)(int)fVar71;
                    fVar67 = (float)(int)fVar72;
                    fVar69 = (float)(int)fVar73;
                    fVar70 = (float)(int)fVar74;
                    fVar65 = fVar65 - (float)(-(uint)(fVar71 < fVar65) & (uint)fVar52);
                    fVar67 = fVar67 - (float)(-(uint)(fVar72 < fVar67) & (uint)fVar53);
                    fVar69 = fVar69 - (float)(-(uint)(fVar73 < fVar69) & (uint)fVar54);
                    fVar70 = fVar70 - (float)(-(uint)(fVar74 < fVar70) & (uint)fVar55);
                    fVar71 = auVar62._0_4_ - fVar65 * 0.6931472;
                    fVar72 = auVar62._4_4_ - fVar67 * 0.6931472;
                    fVar73 = auVar62._8_4_ - fVar69 * 0.6931472;
                    fVar74 = auVar62._12_4_ - fVar70 * 0.6931472;
                    auVar58._0_4_ =
                         fVar71 + fVar52 +
                         (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) *
                            fVar71 + 0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) *
                         fVar71 * fVar71;
                    auVar58._4_4_ =
                         fVar72 + fVar53 +
                         (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) *
                            fVar72 + 0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) *
                         fVar72 * fVar72;
                    auVar58._8_4_ =
                         fVar73 + fVar54 +
                         (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) *
                            fVar73 + 0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) *
                         fVar73 * fVar73;
                    auVar58._12_4_ =
                         fVar74 + fVar55 +
                         (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) *
                            fVar74 + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) *
                         fVar74 * fVar74;
                    fVar65 = (float)((int)fVar65 * 0x800000 + (int)fVar52) * auVar58._0_4_ + fVar52;
                    fVar67 = (float)((int)fVar67 * 0x800000 + (int)fVar53) * auVar58._4_4_ + fVar53;
                    fVar69 = (float)((int)fVar69 * 0x800000 + (int)fVar54) * auVar58._8_4_ + fVar54;
                    fVar70 = (float)((int)fVar70 * 0x800000 + (int)fVar55) * auVar58._12_4_ + fVar55
                    ;
                    auVar4._4_4_ = fVar67;
                    auVar4._0_4_ = fVar65;
                    auVar4._8_4_ = fVar69;
                    auVar4._12_4_ = fVar70;
                    auVar62 = rcpps(auVar58,auVar4);
                    fVar71 = auVar62._0_4_;
                    fVar72 = auVar62._4_4_;
                    fVar73 = auVar62._8_4_;
                    fVar74 = auVar62._12_4_;
                    auVar76._0_4_ =
                         fVar56 * (fVar71 + fVar71 + -1.0 +
                                  (2.0 - fVar65 * (fVar71 + fVar71)) * fVar71);
                    auVar76._4_4_ =
                         fVar66 * (fVar72 + fVar72 + -1.0 +
                                  (2.0 - fVar67 * (fVar72 + fVar72)) * fVar72);
                    auVar76._8_4_ =
                         fVar63 * (fVar73 + fVar73 + -1.0 +
                                  (2.0 - fVar69 * (fVar73 + fVar73)) * fVar73);
                    auVar76._12_4_ =
                         fVar68 * (fVar74 + fVar74 + -1.0 +
                                  (2.0 - fVar70 * (fVar74 + fVar74)) * fVar74);
                    break;
                  case 6:
                    fVar71 = **(float **)(&this->field_0x120 + (long)p_Var37);
                    fVar72 = (*(float **)(&this->field_0x120 + (long)p_Var37))[1];
                    auVar61._0_4_ = fVar71 * fVar56 + fVar72;
                    auVar61._4_4_ = fVar71 * fVar66 + fVar72;
                    auVar61._8_4_ = fVar71 * fVar63 + fVar72;
                    auVar61._12_4_ = fVar71 * fVar68 + fVar72;
                    auVar62 = maxps(auVar61,auVar62);
                    auVar62 = minps(auVar62,auVar29);
                    auVar76._0_4_ = fVar56 * auVar62._0_4_;
                    auVar76._4_4_ = fVar66 * auVar62._4_4_;
                    auVar76._8_4_ = fVar63 * auVar62._8_4_;
                    auVar76._12_4_ = fVar68 * auVar62._12_4_;
                  }
                  *(undefined1 (*) [16])ppvVar41 = auVar76;
                  ppvVar41 = ppvVar41 + 2;
                  iVar39 = iVar39 + 1;
                  iVar5 = iVar5 + 1;
                } while (iVar39 != iVar45);
              }
              fVar56 = (float)((int)local_88 + 1);
            } while ((float)((int)local_88 + 1) != _h);
          }
          local_1f8 = local_1f8 + 1;
        } while (local_1f8 != local_190);
      }
    }
    else {
      uVar34 = (iVar46 * iVar39) / iVar5;
      uVar35 = *(int *)(&this->field_0xd0 + (long)p_Var37) / iVar5;
      iVar36 = 1;
      uVar51 = 1;
      if (opt->use_packing_layout == true) {
        iVar36 = (uint)((uVar34 & 3) == 0) * 3 + 1;
        uVar51 = (uint)((uVar35 & 3) == 0) * 3 + 1;
      }
      local_188.data = local_208->data;
      piVar8 = local_208->refcount;
      local_188.refcount._0_4_ = SUB84(piVar8,0);
      local_188.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
      local_188.elemsize._0_4_ = (undefined4)local_208->elemsize;
      local_188.elemsize._4_4_ = (undefined4)(local_208->elemsize >> 0x20);
      local_188.elempack = local_208->elempack;
      local_188.allocator = local_208->allocator;
      local_188.dims = local_208->dims;
      local_188.w = local_208->w;
      local_188.h = local_208->h;
      local_188.d = local_208->d;
      local_188.c = local_208->c;
      local_188.cstep = local_208->cstep;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      if (iVar36 < iVar46) {
        local_1e8.data = *(void **)opt;
        uVar19 = opt->openmp_blocktime;
        uVar20 = opt->use_winograd_convolution;
        uVar22 = opt->use_sgemm_convolution;
        uVar24 = opt->use_int8_inference;
        uVar26 = opt->use_vulkan_compute;
        uVar25 = CONCAT11(uVar26,uVar24);
        uVar23 = CONCAT21(uVar25,uVar22);
        uVar21 = CONCAT31(uVar23,uVar20);
        local_1e8.allocator = *(Allocator **)&opt->use_bf16_storage;
        local_1e8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
        local_1e8._48_8_ = *(undefined8 *)&opt->flush_denormals;
        local_1e8.c._0_1_ = opt->use_winograd43_convolution;
        local_1e8.c._1_1_ = opt->use_winograd63_convolution;
        local_1e8.c._2_1_ = opt->use_a53_a55_optimized_kernel;
        local_1e8.c._3_1_ = opt->use_reserved_7;
        local_1e8._60_1_ = opt->use_reserved_8;
        local_1e8._61_1_ = opt->use_reserved_9;
        local_1e8._62_1_ = opt->use_reserved_10;
        local_1e8._63_1_ = opt->use_reserved_11;
        local_1e8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
        local_1e8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        local_1e8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
        local_1e8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        local_1e8.elempack = uVar19;
        local_1e8._28_4_ = uVar21;
        convert_packing(local_208,&local_188,iVar36,(Option *)&local_1e8);
      }
      piVar8 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
      local_1e8.data = local_258.data;
      local_1e8.refcount._0_4_ = local_258.refcount._0_4_;
      local_1e8.refcount._4_4_ = local_258.refcount._4_4_;
      local_1e8.elemsize._0_4_ = (undefined4)local_258.elemsize;
      local_1e8.elemsize._4_4_ = local_258.elemsize._4_4_;
      local_1e8.elempack = local_258.elempack;
      local_1e8.allocator = local_258.allocator;
      local_1e8.w = local_258.w;
      local_1e8.dims = local_258.dims;
      local_1e8.d = local_258.d;
      local_1e8.h = local_258.h;
      local_1e8.c = local_258.c;
      local_1e8.cstep = local_258.cstep;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      if ((uVar51 < uVar43) &&
         ((Mat::create(&local_1e8,iVar45,(int)_h,
                       *(int *)(&this->field_0xd0 + (long)this->_vptr_DeconvolutionDepthWise_x86[-3]
                               ) / (int)uVar51,(ulong)uVar51 * (sVar49 / uVar43),uVar51,
                       opt->workspace_allocator), (Mat *)local_1e8.data == (Mat *)0x0 ||
          ((long)local_1e8.c * local_1e8.cstep == 0)))) {
        piVar8 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
        iVar36 = -100;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_1e8.allocator == (Allocator *)0x0) {
              if ((Mat *)local_1e8.data != (Mat *)0x0) {
                free(local_1e8.data);
              }
            }
            else {
              (*(local_1e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_1e8.cstep = 0;
        local_1e8.data = (void *)0x0;
        local_1e8.refcount._0_4_ = 0;
        local_1e8.refcount._4_4_ = 0;
        local_1e8.elemsize._0_4_ = 0;
        local_1e8.elemsize._4_4_ = 0;
        local_1e8.elempack = 0;
        local_1e8.dims = 0;
        local_1e8.w = 0;
        local_1e8.h = 0;
        local_1e8.d = 0;
        local_1e8._56_8_ = local_1e8._56_8_ & 0xffffffff00000000;
        piVar8 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              if (local_188.data != (void *)0x0) {
                free(local_188.data);
              }
            }
            else {
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_188.cstep = 0;
        local_188.data = (void *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.elemsize._0_4_ = 0;
        local_188.elemsize._4_4_ = 0;
        local_188.elempack = 0;
        local_188.dims = 0;
        local_188.w = 0;
        local_188.h = 0;
        local_188.d = 0;
        local_188.c = 0;
        goto LAB_00451241;
      }
      if (0 < *(int *)(&this->field_0x114 + (long)this->_vptr_DeconvolutionDepthWise_x86[-3])) {
        local_1f0 = CONCAT44(local_1f0._4_4_,(int)uVar34 / iVar36);
        iVar45 = 0;
        iVar44 = 0;
        lVar40 = 0;
        do {
          local_98 = CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          local_d8 = (void *)((long)(iVar45 / iVar36) * local_188.cstep * local_98 +
                             (long)local_188.data);
          lVar47 = (long)local_188.h;
          uStack_d0 = 0;
          uStack_cc = 0;
          local_c8 = (undefined4)local_188.elemsize;
          uStack_c4 = local_188.elemsize._4_4_;
          local_c0 = local_188.elempack;
          local_b8 = local_188.allocator;
          lVar50 = (long)local_188.d;
          uStack_a8._0_4_ = local_188.h;
          uStack_a8._4_4_ = local_188.d;
          local_a0 = (undefined4)local_1f0;
          local_98 = (lVar50 * local_98 * lVar47 * local_188.w + 0xf & 0xfffffffffffffff0) /
                     local_98;
          local_b0._0_4_ = local_188.dims;
          local_b0._4_4_ = local_188.w;
          lVar47 = (long)local_1e8.h;
          local_e8 = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
          local_128 = (Mat *)((long)(void **)local_1e8.data +
                             (long)(iVar44 / (int)uVar51) * local_1e8.cstep * local_e8);
          uStack_120 = 0;
          uStack_11c = 0;
          local_118 = (undefined4)local_1e8.elemsize;
          uStack_114 = local_1e8.elemsize._4_4_;
          local_110 = local_1e8.elempack;
          local_108 = local_1e8.allocator;
          lVar50 = (long)local_1e8.d;
          uStack_f8._0_4_ = local_1e8.h;
          uStack_f8._4_4_ = local_1e8.d;
          local_e8 = (lVar50 * local_e8 * lVar47 * local_1e8.w + 0xf & 0xfffffffffffffff0) /
                     local_e8;
          local_100._0_4_ = local_1e8.dims;
          local_100._4_4_ = local_1e8.w;
          pLVar12 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar40];
          local_78._0_1_ = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78._4_4_ = opt->num_threads;
          local_68 = *(undefined4 *)&opt->workspace_allocator;
          uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
          iStack_60 = opt->openmp_blocktime;
          uStack_5c._0_1_ = opt->use_winograd_convolution;
          uStack_5c._1_1_ = opt->use_sgemm_convolution;
          uStack_5c._2_1_ = opt->use_int8_inference;
          uStack_5c._3_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          local_48 = opt->flush_denormals;
          uStack_44._0_1_ = opt->use_local_pool_allocator;
          uStack_44._1_1_ = opt->use_shader_local_memory;
          uStack_44._2_1_ = opt->use_cooperative_matrix;
          uStack_44._3_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_3c._0_1_ = opt->use_reserved_8;
          uStack_3c._1_1_ = opt->use_reserved_9;
          uStack_3c._2_1_ = opt->use_reserved_10;
          uStack_3c._3_1_ = opt->use_reserved_11;
          pAStack_70 = local_1e8.allocator;
          local_f0 = (int)uVar35 / (int)uVar51;
          (*pLVar12->_vptr_Layer[7])(pLVar12,&local_d8,&local_128,&local_78);
          piVar8 = (int *)CONCAT44(uStack_11c,uStack_120);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_108 == (Allocator *)0x0) {
                if (local_128 != (Mat *)0x0) {
                  free(local_128);
                }
              }
              else {
                (*local_108->_vptr_Allocator[3])();
              }
            }
          }
          local_e8 = 0;
          local_128 = (Mat *)0x0;
          uStack_120 = 0;
          uStack_11c = 0;
          local_118 = 0;
          uStack_114 = 0;
          local_110 = 0;
          local_100 = 0;
          uStack_f8 = 0;
          local_f0 = 0;
          piVar8 = (int *)CONCAT44(uStack_cc,uStack_d0);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_b8 == (Allocator *)0x0) {
                if (local_d8 != (void *)0x0) {
                  free(local_d8);
                }
              }
              else {
                (*local_b8->_vptr_Allocator[3])();
              }
            }
          }
          local_98 = 0;
          local_d8 = (void *)0x0;
          uStack_d0 = 0;
          uStack_cc = 0;
          local_c8 = 0;
          uStack_c4 = 0;
          local_c0 = 0;
          local_b0 = 0;
          uStack_a8 = 0;
          local_a0 = 0;
          lVar40 = lVar40 + 1;
          iVar44 = iVar44 + uVar35;
          iVar45 = iVar45 + uVar34;
        } while (lVar40 < *(int *)(&this->field_0x114 +
                                  (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
      }
      if (uVar51 < uVar43) {
        convert_packing(&local_1e8,&local_258,uVar43,opt);
      }
      else {
        piVar8 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        piVar8 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_258.allocator == (Allocator *)0x0) {
              if ((Mat *)local_258.data != (Mat *)0x0) {
                free(local_258.data);
              }
            }
            else {
              (*(local_258.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_258.data = local_1e8.data;
        local_258.refcount._0_4_ = local_1e8.refcount._0_4_;
        local_258.refcount._4_4_ = local_1e8.refcount._4_4_;
        local_258.elemsize._0_4_ = (undefined4)local_1e8.elemsize;
        local_258.elemsize._4_4_ = local_1e8.elemsize._4_4_;
        local_258.elempack = local_1e8.elempack;
        local_258.allocator = local_1e8.allocator;
        local_258.dims = local_1e8.dims;
        local_258.w = local_1e8.w;
        local_258.h = local_1e8.h;
        local_258.d = local_1e8.d;
        local_258.c = local_1e8.c;
        local_258.cstep = local_1e8.cstep;
      }
      piVar8 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if ((Mat *)local_1e8.data != (Mat *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1e8.cstep = 0;
      local_1e8.data = (void *)0x0;
      local_1e8.refcount._0_4_ = 0;
      local_1e8.refcount._4_4_ = 0;
      local_1e8.elemsize._0_4_ = 0;
      local_1e8.elemsize._4_4_ = 0;
      local_1e8.elempack = 0;
      local_1e8.dims = 0;
      local_1e8.w = 0;
      local_1e8.h = 0;
      local_1e8.d = 0;
      local_1e8._56_8_ = local_1e8._56_8_ & 0xffffffff00000000;
      piVar8 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
            if (local_188.data != (void *)0x0) {
              free(local_188.data);
            }
          }
          else {
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
    }
    pMVar30 = local_138;
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86 +
               (long)this->_vptr_DeconvolutionDepthWise_x86[-3]),&local_258,local_138,opt);
    iVar36 = -100;
    if ((pMVar30->data != (void *)0x0) && (iVar36 = -100, (long)pMVar30->c * pMVar30->cstep != 0)) {
      iVar36 = 0;
    }
  }
LAB_00451241:
  piVar8 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_258.allocator == (Allocator *)0x0) {
        if ((Mat *)local_258.data != (Mat *)0x0) {
          free(local_258.data);
        }
      }
      else {
        (*(local_258.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar36;
}

Assistant:

int DeconvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}